

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

Arg * __thiscall fmt::internal::ArgMap<char>::find(ArgMap<char> *this,BasicStringRef<char> *name)

{
  pointer ppVar1;
  bool bVar2;
  pointer ppVar3;
  
  ppVar3 = (this->map_).
           super__Vector_base<std::pair<fmt::BasicStringRef<char>,_fmt::internal::Arg>,_std::allocator<std::pair<fmt::BasicStringRef<char>,_fmt::internal::Arg>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (this->map_).
           super__Vector_base<std::pair<fmt::BasicStringRef<char>,_fmt::internal::Arg>,_std::allocator<std::pair<fmt::BasicStringRef<char>,_fmt::internal::Arg>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (ppVar3 == ppVar1) {
      return (Arg *)0x0;
    }
    bVar2 = operator==(ppVar3->first,*name);
    if (bVar2) break;
    ppVar3 = ppVar3 + 1;
  }
  return &ppVar3->second;
}

Assistant:

const internal::Arg *find(const fmt::BasicStringRef<Char> &name) const {
    // The list is unsorted, so just return the first matching name.
    for (typename MapType::const_iterator it = map_.begin(), end = map_.end();
         it != end; ++it) {
      if (it->first == name)
        return &it->second;
    }
    return FMT_NULL;
  }